

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

char * GmfReadByteFlow(int64_t MshIdx,int *NmbByt)

{
  undefined4 uVar1;
  int64_t iVar2;
  char *pcVar3;
  char *pcVar4;
  GmfMshSct *msh;
  
  pcVar3 = (char *)0x0;
  iVar2 = GmfStatKwd(MshIdx,0x7e);
  if (iVar2 != 0) {
    pcVar3 = (char *)malloc(iVar2 * 4);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      uVar1 = *(undefined4 *)(MshIdx + 0x10);
      *(undefined4 *)(MshIdx + 0x10) = 1;
      if (*(long *)(MshIdx + 0x192ad8) != 0) {
        fseek(*(FILE **)(MshIdx + 0x300410),*(long *)(MshIdx + 0x192ae0),0);
      }
      GmfGetLin(MshIdx,0x7e,NmbByt);
      pcVar4 = pcVar3;
      do {
        GmfGetLin(MshIdx,0x7e,pcVar4);
        pcVar4 = pcVar4 + 4;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      *(undefined4 *)(MshIdx + 0x10) = uVar1;
    }
  }
  return pcVar3;
}

Assistant:

char *GmfReadByteFlow(int64_t MshIdx, int *NmbByt)
{
   int         cod, *WrdTab;
   size_t      i, NmbWrd;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;

   // Read and allocate the number of 4-byte words in the byteflow
   if(!(NmbWrd = GmfStatKwd(MshIdx, GmfByteFlow)))
      return(NULL);

   if(!(WrdTab = malloc(NmbWrd * WrdSiz)))
      return(NULL);

   // Disable the endianess conversion
   cod = msh->cod;
   msh->cod = 1;

   // Read the exact number of bytes in the byteflow
   GmfGotoKwd(MshIdx, GmfByteFlow);
   GmfGetLin(MshIdx, GmfByteFlow, NmbByt);

   // Read the byteflow as 4-byte blocks
   for(i=0;i<NmbWrd;i++)
      GmfGetLin(MshIdx, GmfByteFlow, &WrdTab[i]);

   // Enable endianess convertion
   msh->cod = cod;

   return((char *)WrdTab);
}